

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O0

void __thiscall
Assimp::SplitLargeMeshesProcess_Vertex::SplitMesh
          (SplitLargeMeshesProcess_Vertex *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  uint pID;
  value_type vVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *pvVar19;
  bool bVar20;
  uint uVar21;
  VertexWeightTable *pVVar22;
  aiMesh *this_00;
  pointer puVar23;
  aiColor4t<float> *paVar24;
  aiVector3t<float> *paVar25;
  reference pvVar26;
  uint *puVar27;
  reference ppVar28;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *pvVar29;
  aiBone *paVar30;
  aiVertexWeight *paVar31;
  reference __src;
  size_type sVar32;
  ulong uVar33;
  size_type *psVar34;
  reference pvVar35;
  VertexWeightTable *this_01;
  undefined8 *puVar36;
  pointer ppVar37;
  aiFace *paVar38;
  ulong uVar39;
  aiFace *local_768;
  aiVertexWeight *local_720;
  aiVector3t<float> *local_6a8;
  aiColor4t<float> *local_678;
  aiVector3t<float> *local_648;
  aiVector3t<float> *local_620;
  aiVector3t<float> *local_5f0;
  aiVector3t<float> *local_5c0;
  pair<aiMesh_*,_unsigned_int> local_578;
  int local_564;
  pair<aiMesh_*,_unsigned_int> local_560;
  uint local_550;
  undefined1 local_54c [4];
  uint p;
  aiBone *local_148;
  aiBone *pcOut;
  aiBone *pcOldBone;
  BoneWeightList *pcWeightList_1;
  pointer puStack_128;
  uint k;
  aiBone **ppCurrent;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *local_118;
  BoneWeightList *pcWeightList;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_108;
  __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_100;
  const_iterator iter;
  VertexWeightTable *table;
  uint c_3;
  uint c_2;
  uint iIndex_1;
  uint v_1;
  aiFace *rFace;
  uint local_c8;
  uint local_c4;
  uint iIndex;
  uint v;
  uint iNeed;
  uint iNumIndices;
  uint c_1;
  uint c;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  uint *elem;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  aiMesh *pcMesh;
  uint iOutVertexNum;
  uint iBase;
  uint iEstimatedSize;
  value_type_conflict4 local_54;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> avWasCopied;
  uint iSubMeshes;
  VertexWeightTable *avPerVertexWeights;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *avList_local;
  aiMesh *pMesh_local;
  SplitLargeMeshesProcess_Vertex *pSStack_10;
  uint a_local;
  SplitLargeMeshesProcess_Vertex *this_local;
  
  avList_local = (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  *)pMesh;
  pMesh_local._4_4_ = a;
  pSStack_10 = this;
  if (this->LIMIT < pMesh->mNumVertices) {
    pVVar22 = ComputeVertexBoneWeightTable(pMesh);
    avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         *(uint *)((long)&(avList_local->
                          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4) / this->LIMIT + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    local_54 = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
               (ulong)*(uint *)((long)&(avList_local->
                                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 4),&local_54);
    uVar21 = *(uint *)&(avList_local->
                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish /
             avWasCopied.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    iOutVertexNum = (uVar21 >> 3) + uVar21;
    pcMesh._4_4_ = 0;
    do {
      pcMesh._0_4_ = this->LIMIT;
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      this_00->mNumVertices = 0;
      this_00->mMaterialIndex =
           *(uint *)&avList_local[9].
                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __range4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00;
      aiString::operator=(&this_00->mName,
                          (aiString *)
                          ((long)&avList_local[9].
                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      bVar20 = aiMesh::HasBones((aiMesh *)avList_local);
      if (bVar20) {
        puVar23 = (pointer)operator_new__((ulong)*(uint *)&avList_local[9].
                                                                                                                      
                                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start << 3);
        __range4[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar23;
        memset(__range4[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,0,
               (ulong)*(uint *)&avList_local[9].
                                super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start << 3);
      }
      if (pcMesh._4_4_ != 0) {
        __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
        elem = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
        while (bVar20 = __gnu_cxx::operator!=
                                  (&__end4,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                            *)&elem), bVar20) {
          vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               (pointer)__gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end4);
          (vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage)->mNumIndices = 0xffffffff;
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end4);
        }
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::vector
                ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
      bVar20 = aiMesh::HasPositions((aiMesh *)avList_local);
      if (bVar20) {
        uVar33 = (ulong)(uint)pcMesh;
        paVar25 = (aiVector3t<float> *)operator_new__(uVar33 * 0xc);
        if (uVar33 != 0) {
          local_5c0 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_5c0);
            local_5c0 = local_5c0 + 1;
          } while (local_5c0 != paVar25 + uVar33);
        }
        (__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)paVar25;
      }
      bVar20 = aiMesh::HasNormals((aiMesh *)avList_local);
      if (bVar20) {
        uVar33 = (ulong)(uint)pcMesh;
        paVar25 = (aiVector3t<float> *)operator_new__(uVar33 * 0xc);
        if (uVar33 != 0) {
          local_5f0 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_5f0);
            local_5f0 = local_5f0 + 1;
          } while (local_5f0 != paVar25 + uVar33);
        }
        __range4[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar25;
      }
      bVar20 = aiMesh::HasTangentsAndBitangents((aiMesh *)avList_local);
      if (bVar20) {
        uVar33 = (ulong)(uint)pcMesh;
        paVar25 = (aiVector3t<float> *)operator_new__(uVar33 * 0xc);
        if (uVar33 != 0) {
          local_620 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_620);
            local_620 = local_620 + 1;
          } while (local_620 != paVar25 + uVar33);
        }
        __range4[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)paVar25;
        uVar33 = (ulong)(uint)pcMesh;
        paVar25 = (aiVector3t<float> *)operator_new__(uVar33 * 0xc);
        if (uVar33 != 0) {
          local_648 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_648);
            local_648 = local_648 + 1;
          } while (local_648 != paVar25 + uVar33);
        }
        __range4[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)paVar25;
      }
      iNumIndices = 0;
      while (bVar20 = aiMesh::HasVertexColors((aiMesh *)avList_local,iNumIndices), bVar20) {
        uVar33 = (ulong)(uint)pcMesh;
        paVar24 = (aiColor4t<float> *)operator_new__(uVar33 << 4);
        if (uVar33 != 0) {
          local_678 = paVar24;
          do {
            aiColor4t<float>::aiColor4t(local_678);
            local_678 = local_678 + 1;
          } while (local_678 != paVar24 + uVar33);
        }
        (&__range4[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start)[iNumIndices] = (pointer)paVar24;
        iNumIndices = iNumIndices + 1;
      }
      iNeed = 0;
      while (bVar20 = aiMesh::HasTextureCoords((aiMesh *)avList_local,iNeed), bVar20) {
        *(undefined4 *)
         ((long)&__range4[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish + (ulong)iNeed * 4) =
             *(undefined4 *)
              ((long)&avList_local[7].
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + (ulong)iNeed * 4);
        uVar33 = (ulong)(uint)pcMesh;
        paVar25 = (aiVector3t<float> *)operator_new__(uVar33 * 0xc);
        if (uVar33 != 0) {
          local_6a8 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_6a8);
            local_6a8 = local_6a8 + 1;
          } while (local_6a8 != paVar25 + uVar33);
        }
        (&__range4[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)[iNeed] = (pointer)paVar25;
        iNeed = iNeed + 1;
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::reserve
                ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1,(ulong)iOutVertexNum);
      do {
        if (*(uint *)&(avList_local->
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish <= pcMesh._4_4_) break;
        v = *(uint *)&avList_local[8].
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[pcMesh._4_4_].first;
        iIndex = 0;
        for (local_c4 = 0; local_c4 < v; local_c4 = local_c4 + 1) {
          local_c8 = *(uint *)(*(long *)&avList_local[8].
                                         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         [pcMesh._4_4_].second + (ulong)local_c4 * 4);
          pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                               (ulong)local_c8);
          if (*pvVar26 == 0xffffffff) {
            iIndex = iIndex + 1;
          }
        }
        if ((uint)pcMesh <
            *(int *)((long)&(__range4->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + 4) + iIndex) break;
        aiFace::aiFace((aiFace *)&rFace);
        std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                  ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1,(aiFace *)&rFace);
        aiFace::~aiFace((aiFace *)&rFace);
        pvVar35 = std::vector<aiFace,_std::allocator<aiFace>_>::back
                            ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
        pvVar35->mNumIndices = v;
        puVar27 = (uint *)operator_new__((ulong)v << 2);
        pvVar35->mIndices = puVar27;
        uVar21 = pvVar35->mNumIndices;
        if (uVar21 == 1) {
          *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start =
               *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start | 1;
        }
        else if (uVar21 == 2) {
          *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start =
               *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start | 2;
        }
        else if (uVar21 == 3) {
          *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start =
               *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start | 4;
        }
        else {
          *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start =
               *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start | 8;
        }
        for (c_2 = 0; c_2 < v; c_2 = c_2 + 1) {
          uVar21 = *(uint *)(*(long *)&avList_local[8].
                                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage
                                       [pcMesh._4_4_].second + (ulong)c_2 * 4);
          pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                               (ulong)uVar21);
          if (*pvVar26 == 0xffffffff) {
            ppVar37 = (avList_local->
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar23 = (__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar33 = (ulong)*(uint *)((long)&(__range4->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 4);
            puVar23[uVar33 * 3 + 2] = (&ppVar37->second)[(ulong)uVar21 * 3];
            *(undefined8 *)(puVar23 + uVar33 * 3) =
                 *(undefined8 *)((long)&ppVar37->first + (ulong)uVar21 * 0xc);
            bVar20 = aiMesh::HasNormals((aiMesh *)avList_local);
            if (bVar20) {
              puVar36 = (undefined8 *)
                        ((long)&(avList_local[1].
                                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first +
                        (ulong)uVar21 * 0xc);
              puVar23 = __range4[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        (ulong)*(uint *)((long)&(__range4->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_start + 4) * 3;
              *(undefined8 *)puVar23 = *puVar36;
              puVar23[2] = *(uint *)(puVar36 + 1);
            }
            bVar20 = aiMesh::HasTangentsAndBitangents((aiMesh *)avList_local);
            if (bVar20) {
              puVar36 = (undefined8 *)
                        ((long)&(avList_local[1].
                                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->first +
                        (ulong)uVar21 * 0xc);
              puVar23 = __range4[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                        (ulong)*(uint *)((long)&(__range4->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_start + 4) * 3;
              *(undefined8 *)puVar23 = *puVar36;
              puVar23[2] = *(uint *)(puVar36 + 1);
              puVar36 = (undefined8 *)
                        ((long)&(avList_local[1].
                                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                        (ulong)uVar21 * 0xc);
              puVar23 = __range4[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage +
                        (ulong)*(uint *)((long)&(__range4->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_start + 4) * 3;
              *(undefined8 *)puVar23 = *puVar36;
              puVar23[2] = *(uint *)(puVar36 + 1);
            }
            for (table._4_4_ = 0; table._4_4_ < 8; table._4_4_ = table._4_4_ + 1) {
              bVar20 = aiMesh::HasTextureCoords((aiMesh *)avList_local,table._4_4_);
              if (bVar20) {
                puVar36 = (undefined8 *)
                          ((long)&(&avList_local[4].
                                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)[table._4_4_]
                                  ->first + (ulong)uVar21 * 0xc);
                puVar23 = (&__range4[4].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)[table._4_4_] +
                          (ulong)*(uint *)((long)&(__range4->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 4) *
                          3;
                *(undefined8 *)puVar23 = *puVar36;
                puVar23[2] = *(uint *)(puVar36 + 1);
              }
            }
            for (table._0_4_ = 0; (uint)table < 8; table._0_4_ = (uint)table + 1) {
              bVar20 = aiMesh::HasVertexColors((aiMesh *)avList_local,(uint)table);
              if (bVar20) {
                ppVar37 = (&avList_local[2].
                            super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)[(uint)table] + uVar21;
                puVar23 = (&__range4[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start)[(uint)table] +
                          (ulong)*(uint *)((long)&(__range4->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 4) *
                          4;
                *(aiMesh **)puVar23 = ppVar37->first;
                uVar3 = *(undefined4 *)&ppVar37->field_0xc;
                puVar23[2] = ppVar37->second;
                puVar23[3] = uVar3;
              }
            }
            pvVar35->mIndices[c_2] =
                 *(uint *)((long)&(__range4->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start + 4);
            if (pVVar22 != (VertexWeightTable *)0x0) {
              iter._M_current =
                   (pair<unsigned_int,_float> *)
                   (pVVar22 +
                   *(uint *)((long)&(__range4->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + 4));
              bVar20 = std::
                       vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ::empty((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                *)iter._M_current);
              if (!bVar20) {
                local_108._M_current =
                     (pair<unsigned_int,_float> *)
                     std::
                     vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ::begin(iter._M_current);
                __gnu_cxx::
                __normal_iterator<std::pair<unsigned_int,float>const*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>
                ::__normal_iterator<std::pair<unsigned_int,float>*>
                          ((__normal_iterator<std::pair<unsigned_int,float>const*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>
                            *)&local_100,&local_108);
                while( true ) {
                  pcWeightList = (BoneWeightList *)
                                 std::
                                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ::end((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                        *)iter._M_current);
                  bVar20 = __gnu_cxx::operator!=
                                     (&local_100,
                                      (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                       *)&pcWeightList);
                  if (!bVar20) break;
                  puVar23 = __range4[9].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  ppVar28 = __gnu_cxx::
                            __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                            ::operator*(&local_100);
                  local_118 = *(vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> **)
                               (puVar23 + (ulong)ppVar28->first * 2);
                  if (local_118 == (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)0x0) {
                    pvVar29 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                              operator_new(0x18);
                    memset(pvVar29,0,0x18);
                    std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::vector(pvVar29);
                    puVar23 = __range4[9].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                    local_118 = pvVar29;
                    ppVar28 = __gnu_cxx::
                              __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                              ::operator*(&local_100);
                    *(vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> **)
                     (puVar23 + (ulong)ppVar28->first * 2) = pvVar29;
                  }
                  pvVar29 = local_118;
                  pID = *(uint *)((long)&(__range4->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 4);
                  ppVar28 = __gnu_cxx::
                            __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                            ::operator*(&local_100);
                  aiVertexWeight::aiVertexWeight((aiVertexWeight *)&ppCurrent,pID,ppVar28->second);
                  std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                            (pvVar29,(value_type *)&ppCurrent);
                  __gnu_cxx::
                  __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                  ::operator++(&local_100);
                }
              }
            }
            vVar1 = *(value_type *)
                     ((long)&(__range4->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start + 4);
            pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                                 (ulong)uVar21);
            *pvVar26 = vVar1;
            *(int *)((long)&(__range4->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + 4) =
                 *(int *)((long)&(__range4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + 4) + 1;
          }
          else {
            pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                                 (ulong)uVar21);
            pvVar35->mIndices[c_2] = *pvVar26;
          }
        }
        pcMesh._4_4_ = pcMesh._4_4_ + 1;
      } while (*(uint *)((long)&(__range4->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start + 4) != (uint)pcMesh);
      bVar20 = aiMesh::HasBones((aiMesh *)avList_local);
      if (bVar20) {
        puStack_128 = __range4[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        for (pcWeightList_1._4_4_ = 0;
            pcWeightList_1._4_4_ <
            *(uint *)&avList_local[9].
                      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcWeightList_1._4_4_ = pcWeightList_1._4_4_ + 1) {
          pcOldBone = *(aiBone **)
                       (__range4[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish + (ulong)pcWeightList_1._4_4_ * 2)
          ;
          if (pcOldBone != (aiBone *)0x0) {
            pcOut = (aiBone *)
                    (&(avList_local[9].
                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->first)[pcWeightList_1._4_4_];
            local_148 = (aiBone *)0x0;
            paVar30 = (aiBone *)operator_new(0x450);
            aiBone::aiBone(paVar30);
            *(aiBone **)puStack_128 = paVar30;
            local_148 = paVar30;
            puStack_128 = puStack_128 + 2;
            aiString::aiString((aiString *)local_54c,&pcOut->mName);
            aiString::operator=(&local_148->mName,(aiString *)local_54c);
            fVar15 = (pcOut->mOffsetMatrix).a1;
            fVar16 = (pcOut->mOffsetMatrix).a2;
            fVar17 = (pcOut->mOffsetMatrix).a3;
            fVar18 = (pcOut->mOffsetMatrix).a4;
            fVar11 = (pcOut->mOffsetMatrix).b1;
            fVar12 = (pcOut->mOffsetMatrix).b2;
            fVar13 = (pcOut->mOffsetMatrix).b3;
            fVar14 = (pcOut->mOffsetMatrix).b4;
            fVar7 = (pcOut->mOffsetMatrix).c1;
            fVar8 = (pcOut->mOffsetMatrix).c2;
            fVar9 = (pcOut->mOffsetMatrix).c3;
            fVar10 = (pcOut->mOffsetMatrix).c4;
            fVar4 = (pcOut->mOffsetMatrix).d2;
            fVar5 = (pcOut->mOffsetMatrix).d3;
            fVar6 = (pcOut->mOffsetMatrix).d4;
            (local_148->mOffsetMatrix).d1 = (pcOut->mOffsetMatrix).d1;
            (local_148->mOffsetMatrix).d2 = fVar4;
            (local_148->mOffsetMatrix).d3 = fVar5;
            (local_148->mOffsetMatrix).d4 = fVar6;
            (local_148->mOffsetMatrix).c1 = fVar7;
            (local_148->mOffsetMatrix).c2 = fVar8;
            (local_148->mOffsetMatrix).c3 = fVar9;
            (local_148->mOffsetMatrix).c4 = fVar10;
            (local_148->mOffsetMatrix).b1 = fVar11;
            (local_148->mOffsetMatrix).b2 = fVar12;
            (local_148->mOffsetMatrix).b3 = fVar13;
            (local_148->mOffsetMatrix).b4 = fVar14;
            (local_148->mOffsetMatrix).a1 = fVar15;
            (local_148->mOffsetMatrix).a2 = fVar16;
            (local_148->mOffsetMatrix).a3 = fVar17;
            (local_148->mOffsetMatrix).a4 = fVar18;
            sVar32 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                               ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)pcOldBone
                               );
            local_148->mNumWeights = (uint)sVar32;
            uVar33 = (ulong)local_148->mNumWeights;
            paVar31 = (aiVertexWeight *)operator_new__(uVar33 << 3);
            if (uVar33 != 0) {
              local_720 = paVar31;
              do {
                aiVertexWeight::aiVertexWeight(local_720);
                local_720 = local_720 + 1;
              } while (local_720 != paVar31 + uVar33);
            }
            local_148->mWeights = paVar31;
            paVar31 = local_148->mWeights;
            __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                              ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)pcOldBone,
                               0);
            memcpy(paVar31,__src,(ulong)local_148->mNumWeights << 3);
            paVar30 = pcOldBone;
            if (pcOldBone != (aiBone *)0x0) {
              std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~vector
                        ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)pcOldBone);
              operator_delete(paVar30);
            }
            *(int *)&__range4[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start =
                 *(int *)&__range4[9].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start + 1;
          }
        }
      }
      sVar32 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                         ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sVar32;
      uVar33 = SUB168(auVar2 * ZEXT816(0x10),0);
      uVar39 = uVar33 + 8;
      if (0xfffffffffffffff7 < uVar33) {
        uVar39 = 0xffffffffffffffff;
      }
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
        uVar39 = 0xffffffffffffffff;
      }
      psVar34 = (size_type *)operator_new__(uVar39);
      *psVar34 = sVar32;
      paVar38 = (aiFace *)(psVar34 + 1);
      if (sVar32 != 0) {
        local_768 = paVar38;
        do {
          aiFace::aiFace(local_768);
          local_768 = local_768 + 1;
        } while (local_768 != paVar38 + sVar32);
      }
      __range4[8].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)paVar38;
      sVar32 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                         ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
      *(int *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish = (int)sVar32;
      for (local_550 = 0;
          local_550 <
          *(uint *)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish; local_550 = local_550 + 1) {
        pvVar35 = std::vector<aiFace,_std::allocator<aiFace>_>::operator[]
                            ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1,(ulong)local_550);
        aiFace::operator=((aiFace *)
                          (__range4[8].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + (ulong)local_550 * 4),pvVar35
                         );
      }
      std::pair<aiMesh_*,_unsigned_int>::pair<aiMesh_*&,_unsigned_int_&,_true>
                (&local_560,(aiMesh **)&__range4,(uint *)((long)&pMesh_local + 4));
      std::
      vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
      ::push_back(avList,&local_560);
      if (pcMesh._4_4_ ==
          *(uint *)&(avList_local->
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_564 = 3;
      }
      else {
        local_564 = 0;
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector
                ((vector<aiFace,_std::allocator<aiFace>_> *)&c_1);
    } while (local_564 == 0);
    if (pVVar22 != (VertexWeightTable *)0x0) {
      this_01 = pVVar22 + (long)pVVar22[-1].
                                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      while (pVVar22 != this_01) {
        this_01 = this_01 + -1;
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        ~vector(this_01);
      }
      operator_delete__(&pVVar22[-1].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pvVar19 = avList_local;
    if (avList_local !=
        (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         *)0x0) {
      aiMesh::~aiMesh((aiMesh *)avList_local);
      operator_delete(pvVar19);
    }
    local_564 = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  }
  else {
    std::pair<aiMesh_*,_unsigned_int>::pair<aiMesh_*&,_unsigned_int_&,_true>
              (&local_578,(aiMesh **)&avList_local,(uint *)((long)&pMesh_local + 4));
    std::
    vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>::
    push_back(avList,&local_578);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Vertex::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumVertices > SplitLargeMeshesProcess_Vertex::LIMIT) {
        typedef std::vector< std::pair<unsigned int,float> > VertexWeightTable;

        // build a per-vertex weight list if necessary
        VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(pMesh);

        // we need to split this mesh into sub meshes
        // determine the estimated size of a submesh
        // (this could be too large. Max waste is a single digit percentage)
        const unsigned int iSubMeshes = (pMesh->mNumVertices / SplitLargeMeshesProcess_Vertex::LIMIT) + 1;

        // create a std::vector<unsigned int> to indicate which vertices
        // have already been copied
        std::vector<unsigned int> avWasCopied;
        avWasCopied.resize(pMesh->mNumVertices,0xFFFFFFFF);

        // try to find a good estimate for the number of output faces
        // per mesh. Add 12.5% as buffer
        unsigned int iEstimatedSize = pMesh->mNumFaces / iSubMeshes;
        iEstimatedSize += iEstimatedSize >> 3;

        // now generate all submeshes
        unsigned int iBase( 0 );
        while (true) {
            const unsigned int iOutVertexNum = SplitLargeMeshesProcess_Vertex::LIMIT;
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumVertices    = 0;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            typedef std::vector<aiVertexWeight> BoneWeightList;
            if (pMesh->HasBones()) {
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];
                ::memset(pcMesh->mBones,0,sizeof(void*)*pMesh->mNumBones);
            }

            // clear the temporary helper array
            if (iBase) {
                // we can't use memset here we unsigned int needn' be 32 bits
                for (auto &elem : avWasCopied) {
                    elem = 0xffffffff;
                }
            }

            // output vectors
            std::vector<aiFace> vFaces;

            // reserve enough storage for most cases
            if (pMesh->HasPositions()) {
                pcMesh->mVertices = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iOutVertexNum];
            }
            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iOutVertexNum];
                pcMesh->mBitangents = new aiVector3D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasVertexColors(c);++c) {
                pcMesh->mColors[c] = new aiColor4D[iOutVertexNum];
            }
            for (unsigned int c = 0; pMesh->HasTextureCoords(c);++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                pcMesh->mTextureCoords[c] = new aiVector3D[iOutVertexNum];
            }
            vFaces.reserve(iEstimatedSize);

            // (we will also need to copy the array of indices)
            while (iBase < pMesh->mNumFaces) {
                // allocate a new array
                const unsigned int iNumIndices = pMesh->mFaces[iBase].mNumIndices;

                // doesn't catch degenerates but is quite fast
                unsigned int iNeed = 0;
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF == avWasCopied[iIndex]) {
                        iNeed++;
                    }
                }
                if (pcMesh->mNumVertices + iNeed > iOutVertexNum) {
                    // don't use this face
                    break;
                }

                vFaces.push_back(aiFace());
                aiFace& rFace = vFaces.back();

                // setup face type and number of indices
                rFace.mNumIndices = iNumIndices;
                rFace.mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (rFace.mNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pMesh->mFaces[iBase].mIndices[v];

                    // check whether we do already have this vertex
                    if (0xFFFFFFFF != avWasCopied[iIndex]) {
                        rFace.mIndices[v] = avWasCopied[iIndex];
                        continue;
                    }

                    // copy positions
                    pcMesh->mVertices[pcMesh->mNumVertices] = (pMesh->mVertices[iIndex]);

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[pcMesh->mNumVertices] = (pMesh->mNormals[iIndex]);
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[pcMesh->mNumVertices] = (pMesh->mTangents[iIndex]);
                        pcMesh->mBitangents[pcMesh->mNumVertices] = (pMesh->mBitangents[iIndex]);
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c)) {
                            pcMesh->mTextureCoords[c][pcMesh->mNumVertices] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][pcMesh->mNumVertices] = pMesh->mColors[c][iIndex];
                        }
                    }
                    // check whether we have bone weights assigned to this vertex
                    rFace.mIndices[v] = pcMesh->mNumVertices;
                    if (avPerVertexWeights) {
                        VertexWeightTable& table = avPerVertexWeights[ pcMesh->mNumVertices ];
                        if( !table.empty() ) {
                            for (VertexWeightTable::const_iterator iter =  table.begin();
                                    iter != table.end();++iter) {
                                // allocate the bone weight array if necessary
                                BoneWeightList* pcWeightList = (BoneWeightList*)pcMesh->mBones[(*iter).first];
                                if (nullptr == pcWeightList) {
                                    pcMesh->mBones[(*iter).first] = (aiBone*)(pcWeightList = new BoneWeightList());
                                }
                                pcWeightList->push_back(aiVertexWeight(pcMesh->mNumVertices,(*iter).second));
                            }
                        }
                    }

                    avWasCopied[iIndex] = pcMesh->mNumVertices;
                    pcMesh->mNumVertices++;
                }
                ++iBase;
                if(pcMesh->mNumVertices == iOutVertexNum) {
                    // break here. The face is only added if it was complete
                    break;
                }
            }

            // check which bones we'll need to create for this submesh
            if (pMesh->HasBones()) {
                aiBone** ppCurrent = pcMesh->mBones;
                for (unsigned int k = 0; k < pMesh->mNumBones;++k) {
                    // check whether the bone is existing
                    BoneWeightList* pcWeightList;
                    if ((pcWeightList = (BoneWeightList*)pcMesh->mBones[k])) {
                        aiBone* pcOldBone = pMesh->mBones[k];
                        aiBone* pcOut( nullptr );
                        *ppCurrent++ = pcOut = new aiBone();
                        pcOut->mName = aiString(pcOldBone->mName);
                        pcOut->mOffsetMatrix = pcOldBone->mOffsetMatrix;
                        pcOut->mNumWeights = (unsigned int)pcWeightList->size();
                        pcOut->mWeights = new aiVertexWeight[pcOut->mNumWeights];

                        // copy the vertex weights
                        ::memcpy(pcOut->mWeights,&pcWeightList->operator[](0),
                            pcOut->mNumWeights * sizeof(aiVertexWeight));

                        // delete the temporary bone weight list
                        delete pcWeightList;
                        pcMesh->mNumBones++;
                    }
                }
            }

            // copy the face list to the mesh
            pcMesh->mFaces = new aiFace[vFaces.size()];
            pcMesh->mNumFaces = (unsigned int)vFaces.size();

            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p] = vFaces[p];
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));

            if (iBase == pMesh->mNumFaces) {
                // have all faces ... finish the outer loop, too
                break;
            }
        }

        // delete the per-vertex weight list again
        delete[] avPerVertexWeights;

        // now delete the old mesh data
        delete pMesh;
        return;
    }
    avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
}